

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O0

bool __thiscall FilteredLT::ignore_node(FilteredLT *this,int u)

{
  bool bVar1;
  GraphPropagator *in_RDI;
  int in_stack_ffffffffffffffdc;
  
  GraphPropagator::getNodeVar(in_RDI,in_stack_ffffffffffffffdc);
  bVar1 = BoolView::isFixed((BoolView *)0x2ab96f);
  if (bVar1) {
    GraphPropagator::getNodeVar(in_RDI,in_stack_ffffffffffffffdc);
    bVar1 = BoolView::isFalse((BoolView *)in_RDI);
    if (bVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool FilteredLT::ignore_node(int u) {
	if (p->getNodeVar(u).isFixed() && p->getNodeVar(u).isFalse()) {
		return true;
	}
	return false;
}